

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_string_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::StringOneofFieldGenerator::StringOneofFieldGenerator
          (StringOneofFieldGenerator *this,FieldDescriptor *descriptor,Options *options)

{
  Options *options_local;
  FieldDescriptor *descriptor_local;
  StringOneofFieldGenerator *this_local;
  
  StringFieldGenerator::StringFieldGenerator(&this->super_StringFieldGenerator,descriptor,options);
  (this->super_StringFieldGenerator).super_FieldGenerator._vptr_FieldGenerator =
       (_func_int **)&PTR__StringOneofFieldGenerator_006f59c0;
  this->dependent_field_ = (bool)(options->proto_h & 1);
  SetCommonOneofFieldVariables(descriptor,&(this->super_StringFieldGenerator).variables_);
  return;
}

Assistant:

StringOneofFieldGenerator::
StringOneofFieldGenerator(const FieldDescriptor* descriptor,
                          const Options& options)
    : StringFieldGenerator(descriptor, options),
      dependent_field_(options.proto_h) {
  SetCommonOneofFieldVariables(descriptor, &variables_);
}